

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall aeron::ClientConductor::onCheckManagedResources(ClientConductor *this,longlong now)

{
  anon_class_16_2_20c820ff_for__M_pred __pred;
  anon_class_16_2_20c820ff_for__M_pred __pred_00;
  iterator __first;
  __normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
  this_00;
  __normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn_*,_std::vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>_>
  in_RDI;
  __normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
  arrayIt;
  __normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn_*,_std::vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>_>
  logIt;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_fffffffffffffef8;
  __normal_iterator<const_aeron::ClientConductor::LogBuffersLingerDefn_*,_std::vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>_>
  *in_stack_ffffffffffffff00;
  ImageList **this_01;
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  *in_stack_ffffffffffffff18;
  longlong in_stack_ffffffffffffff20;
  const_iterator __last;
  const_iterator in_stack_ffffffffffffff28;
  __normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn_*,_std::vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>_>
  __last_00;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8
            );
  __last_00._M_current = in_RDI._M_current + 6;
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::begin((vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
           *)in_stack_fffffffffffffef8);
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::end((vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
         *)in_stack_fffffffffffffef8);
  __pred.this = (ClientConductor *)in_stack_ffffffffffffff28._M_current;
  __pred.now = in_stack_ffffffffffffff20;
  std::
  remove_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn*,std::vector<aeron::ClientConductor::LogBuffersLingerDefn,std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>>>,aeron::ClientConductor::onCheckManagedResources(long_long)::__0>
            (in_RDI,__last_00,__pred);
  __last._M_current = in_RDI._M_current + 6;
  __gnu_cxx::
  __normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn_const*,std::vector<aeron::ClientConductor::LogBuffersLingerDefn,std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>>>
  ::__normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn*>
            (in_stack_ffffffffffffff00,
             (__normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn_*,_std::vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>_>
              *)in_stack_fffffffffffffef8);
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::end((vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
         *)in_stack_fffffffffffffef8);
  __gnu_cxx::
  __normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn_const*,std::vector<aeron::ClientConductor::LogBuffersLingerDefn,std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>>>
  ::__normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn*>
            (in_stack_ffffffffffffff00,
             (__normal_iterator<aeron::ClientConductor::LogBuffersLingerDefn_*,_std::vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>_>
              *)in_stack_fffffffffffffef8);
  __first = std::
            vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
            ::erase(in_stack_ffffffffffffff18,in_stack_ffffffffffffff28,__last);
  std::
  vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
  ::begin((vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
           *)in_stack_fffffffffffffef8);
  std::
  vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
  ::end((vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
         *)in_stack_fffffffffffffef8);
  __pred_00.this = (ClientConductor *)__first._M_current;
  __pred_00.now = (longlong)__last._M_current;
  this_00 = std::
            remove_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::ImageListLingerDefn*,std::vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>>,aeron::ClientConductor::onCheckManagedResources(long_long)::__1>
                      ((__normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
                        )in_RDI._M_current,
                       (__normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
                        )__last_00._M_current,__pred_00);
  this_01 = &((ImageListLingerDefn *)((long)in_RDI._M_current + 0xa0))->m_imageList;
  __gnu_cxx::
  __normal_iterator<aeron::ClientConductor::ImageListLingerDefn_const*,std::vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>>
  ::__normal_iterator<aeron::ClientConductor::ImageListLingerDefn*>
            ((__normal_iterator<const_aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
              *)this_01,
             (__normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
              *)in_stack_fffffffffffffef8);
  std::
  vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
  ::end((vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
         *)in_stack_fffffffffffffef8);
  __gnu_cxx::
  __normal_iterator<aeron::ClientConductor::ImageListLingerDefn_const*,std::vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>>
  ::__normal_iterator<aeron::ClientConductor::ImageListLingerDefn*>
            ((__normal_iterator<const_aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
              *)this_01,
             (__normal_iterator<aeron::ClientConductor::ImageListLingerDefn_*,_std::vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>_>
              *)in_stack_fffffffffffffef8);
  std::
  vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
  ::erase((vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
           *)this_00._M_current,(const_iterator)__first._M_current,(const_iterator)__last._M_current
         );
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c87f7);
  return;
}

Assistant:

void ClientConductor::onCheckManagedResources(long long now)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    // erase-remove idiom

    auto logIt = std::remove_if(m_lingeringLogBuffers.begin(), m_lingeringLogBuffers.end(),
        [now, this](const LogBuffersLingerDefn& entry)
        {
            return now > (entry.m_timeOfLastStatusChange + m_resourceLingerTimeoutMs);
        });

    m_lingeringLogBuffers.erase(logIt, m_lingeringLogBuffers.end());

    auto arrayIt = std::remove_if(m_lingeringImageLists.begin(), m_lingeringImageLists.end(),
        [now, this](ImageListLingerDefn & entry)
        {
            if (now > (entry.m_timeOfLastStatusChange + m_resourceLingerTimeoutMs))
            {
                delete[] entry.m_imageList->m_images;
                delete entry.m_imageList;
                entry.m_imageList = nullptr;
                return true;
            }

            return false;
        });

    m_lingeringImageLists.erase(arrayIt, m_lingeringImageLists.end());
}